

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.h
# Opt level: O0

void __thiscall
Symbol::Symbol(Symbol *this,string *name,vector<double,_std::allocator<double>_> *value,
              bool *is_assigned)

{
  bool *is_assigned_local;
  vector<double,_std::allocator<double>_> *value_local;
  string *name_local;
  Symbol *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)name);
  this->type_ = kRealArray;
  this->ret_type_ = kNone;
  UnionValue::UnionValue(&this->value_);
  this->is_assigned_ = true;
  std::vector<double,_std::allocator<double>_>::operator=(&(this->value_).real_array,value);
  return;
}

Assistant:

Symbol(const std::string &name, const std::vector<double> &value, const bool &is_assigned) :
            name_(name), type_(Symbol::Type::kRealArray), ret_type_(Symbol::Type::kNone), is_assigned_(true) {
        value_.real_array = value;
    }